

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase49::run(TestCase49 *this)

{
  StringPtr name;
  bool bVar1;
  uint defaultPort;
  uint32_t uVar2;
  WaitScope *__stat_loc;
  size_t sVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *extraout_RDX_01;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int iVar4;
  char *pcVar5;
  ArrayPtr<const_char> AVar6;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  ReaderOptions readerOpts;
  ReaderOptions readerOpts_00;
  Maybe<capnp::MessageSize> local_650;
  StringPtr local_638;
  Client local_628;
  Client local_618;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_600;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_5c8;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_590;
  uint32_t local_54c [2];
  bool local_541;
  undefined1 local_540 [7];
  bool _kj_shouldLog_4;
  StringPtr local_528;
  Client local_518;
  Client local_508;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_4f0;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_4b8;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_480;
  Maybe<capnp::MessageSize> local_440;
  StringPtr local_428;
  Client local_418;
  Client local_408;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_3f0;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_3b8;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_380;
  uint32_t local_33c [2];
  bool local_331;
  undefined1 local_330 [7];
  bool _kj_shouldLog_3;
  StringPtr local_318;
  Client local_308;
  Client local_2f8;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_2e0;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_2a8;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_270;
  int local_230;
  bool local_229;
  undefined1 auStack_228 [7];
  bool _kj_shouldLog_2;
  size_t local_220;
  bool local_211;
  undefined1 auStack_210 [7];
  bool _kj_shouldLog_1;
  size_t local_208;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_200;
  undefined1 local_1c8 [8];
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  undefined1 local_180 [7];
  bool _kj_shouldLog;
  undefined1 local_168 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  char *local_128;
  undefined1 local_120 [8];
  Client cap;
  EzRpcServer local_f0;
  ArrayPtr<const_char> local_e0;
  undefined1 local_d0 [8];
  EzRpcClient client;
  Client local_b0;
  ArrayPtr<const_char> local_a0;
  Own<capnp::_::TestInterfaceImpl> local_90;
  Client local_80 [2];
  ArrayPtr<const_char> local_60;
  int local_4c;
  undefined1 auStack_48 [4];
  int callCount;
  int iStack_40;
  undefined4 uStack_3c;
  ArrayPtr<const_char> local_30;
  undefined1 local_20 [8];
  EzRpcServer server;
  TestCase49 *this_local;
  
  server.impl.ptr = (Impl *)this;
  kj::StringPtr::StringPtr((StringPtr *)&local_30,"localhost");
  _auStack_48 = 0;
  iStack_40 = 0;
  uStack_3c = 0;
  ReaderOptions::ReaderOptions((ReaderOptions *)auStack_48);
  readerOpts.nestingLimit = iStack_40;
  readerOpts.traversalLimitInWords = _auStack_48;
  readerOpts._12_4_ = 0;
  EzRpcServer::EzRpcServer((EzRpcServer *)local_20,(StringPtr)local_30,0,readerOpts);
  local_4c = 0;
  kj::StringPtr::StringPtr((StringPtr *)&local_60,"cap1");
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&local_90,&local_4c);
  Capability::Client::Client<capnp::_::TestInterfaceImpl,void>(local_80,&local_90);
  EzRpcServer::exportCap((EzRpcServer *)local_20,(StringPtr)local_60,local_80);
  Capability::Client::~Client(local_80);
  kj::Own<capnp::_::TestInterfaceImpl>::~Own(&local_90);
  kj::StringPtr::StringPtr((StringPtr *)&local_a0,"cap2");
  kj::heap<capnp::_::TestCallOrderImpl>();
  Capability::Client::Client<capnp::_::TestCallOrderImpl,void>
            (&local_b0,(Own<capnp::_::TestCallOrderImpl> *)&client.impl.ptr);
  EzRpcServer::exportCap((EzRpcServer *)local_20,(StringPtr)local_a0,&local_b0);
  Capability::Client::~Client(&local_b0);
  kj::Own<capnp::_::TestCallOrderImpl>::~Own((Own<capnp::_::TestCallOrderImpl> *)&client.impl.ptr);
  kj::StringPtr::StringPtr((StringPtr *)&local_e0,"localhost");
  EzRpcServer::getPort(&local_f0);
  __stat_loc = EzRpcServer::getWaitScope((EzRpcServer *)local_20);
  defaultPort = kj::Promise<unsigned_int>::wait((Promise<unsigned_int> *)&local_f0,__stat_loc);
  cap._16_8_ = 0;
  ReaderOptions::ReaderOptions((ReaderOptions *)&cap.field_0x10);
  readerOpts_00._8_8_ = 0;
  readerOpts_00.traversalLimitInWords = cap._16_8_;
  pcVar5 = (char *)cap._16_8_;
  EzRpcClient::EzRpcClient((EzRpcClient *)local_d0,(StringPtr)local_e0,defaultPort,readerOpts_00);
  kj::Promise<unsigned_int>::~Promise((Promise<unsigned_int> *)&local_f0);
  kj::StringPtr::StringPtr((StringPtr *)&request.hook.ptr,"cap1");
  name.content.size_ = (size_t)local_128;
  name.content.ptr = (char *)request.hook.ptr;
  EzRpcClient::importCap<capnproto_test::capnp::test::TestInterface>
            ((Client *)local_120,(EzRpcClient *)local_d0,name);
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_180,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_168,(Client *)local_120,(Maybe<capnp::MessageSize> *)local_180);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_180);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_168,0x7b);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setJ((Builder *)local_168,true);
  __buf = extraout_RDX;
  if (local_4c != 0) {
    response.hook.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    __buf = extraout_RDX_00;
    while ((bool)response.hook.ptr._7_1_ != false) {
      response.hook.ptr._0_4_ = 0;
      local_128 = "\"failed: expected \" \"(0) == (callCount)\", 0, callCount";
      pcVar5 = "failed: expected (0) == (callCount)";
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
                 ,0x3e,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
                 (char (*) [36])"failed: expected (0) == (callCount)",(int *)&response.hook.ptr,
                 &local_4c);
      __buf = extraout_RDX_01;
      response.hook.ptr._7_1_ = false;
    }
  }
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_200,(int)local_168,__buf,(size_t)local_128,(int)pcVar5);
  EzRpcServer::getWaitScope((EzRpcServer *)local_20);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             local_1c8,&local_200);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)&local_200);
  _auStack_210 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                           ((Reader *)local_1c8);
  bVar1 = kj::operator==("foo",(StringPtr *)auStack_210);
  if (!bVar1) {
    local_211 = kj::_::Debug::shouldLog(ERROR);
    while (local_211 != false) {
      AVar6 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                        ((Reader *)local_1c8);
      pcVar5 = "failed: expected (\"foo\") == (response.getX())";
      _auStack_228 = AVar6;
      kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
                 ,0x40,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", \"foo\", response.getX()"
                 ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",
                 (char (*) [4])0xa4c8db,(Reader *)auStack_228);
      local_211 = false;
    }
  }
  if (local_4c != 1) {
    local_229 = kj::_::Debug::shouldLog(ERROR);
    while (local_229 != false) {
      local_230 = 1;
      pcVar5 = "failed: expected (1) == (callCount)";
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
                 ,0x41,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
                 (char (*) [36])"failed: expected (1) == (callCount)",&local_230,&local_4c);
      local_229 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_318,"cap2");
  name_00.content.size_ = (size_t)local_318.content.ptr;
  name_00.content.ptr = local_d0;
  EzRpcClient::importCap((EzRpcClient *)&local_308,name_00);
  Capability::Client::castAs<capnproto_test::capnp::test::TestCallOrder>(&local_2f8,&local_308);
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_330,(void *)0x0);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_2e0,&local_2f8,(Maybe<capnp::MessageSize> *)local_330);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_2a8,(int)&local_2e0,__buf_00,local_318.content.size_,(int)pcVar5);
  EzRpcServer::getWaitScope((EzRpcServer *)local_20);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_270,&local_2a8);
  uVar2 = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::getN
                    (&local_270.super_Reader);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            (&local_270);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &local_2a8);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_2e0);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_330);
  capnproto_test::capnp::test::TestCallOrder::Client::~Client(&local_2f8);
  Capability::Client::~Client(&local_308);
  if (uVar2 != 0) {
    local_331 = kj::_::Debug::shouldLog(ERROR);
    while (iVar4 = (int)pcVar5, local_331 != false) {
      local_33c[1] = 0;
      kj::StringPtr::StringPtr(&local_428,"cap2");
      name_01.content.size_ = (size_t)local_428.content.ptr;
      name_01.content.ptr = local_d0;
      sVar3 = local_428.content.size_;
      EzRpcClient::importCap((EzRpcClient *)&local_418,name_01);
      Capability::Client::castAs<capnproto_test::capnp::test::TestCallOrder>(&local_408,&local_418);
      kj::Maybe<capnp::MessageSize>::Maybe(&local_440,(void *)0x0);
      capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
                (&local_3f0,&local_408,&local_440);
      Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
      ::send(&local_3b8,(int)&local_3f0,__buf_01,sVar3,iVar4);
      EzRpcServer::getWaitScope((EzRpcServer *)local_20);
      kj::
      Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              *)&local_380,&local_3b8);
      local_33c[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::
                     getN(&local_380.super_Reader);
      pcVar5 = 
      "failed: expected (0) == (client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())"
      ;
      kj::_::Debug::log<char_const(&)[149],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
                 ,0x44,ERROR,
                 "\"failed: expected \" \"(0) == (client.importCap(\\\"cap2\\\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())\", 0, client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN()"
                 ,(char (*) [149])
                  "failed: expected (0) == (client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())"
                 ,(int *)(local_33c + 1),local_33c);
      Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
                (&local_380);
      RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::
      ~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                      *)&local_3b8);
      Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
      ::~Request(&local_3f0);
      kj::Maybe<capnp::MessageSize>::~Maybe(&local_440);
      capnproto_test::capnp::test::TestCallOrder::Client::~Client(&local_408);
      Capability::Client::~Client(&local_418);
      local_331 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_528,"cap2");
  name_02.content.size_ = (size_t)local_528.content.ptr;
  name_02.content.ptr = local_d0;
  EzRpcClient::importCap((EzRpcClient *)&local_518,name_02);
  Capability::Client::castAs<capnproto_test::capnp::test::TestCallOrder>(&local_508,&local_518);
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_540,(void *)0x0);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_4f0,&local_508,(Maybe<capnp::MessageSize> *)local_540);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_4b8,(int)&local_4f0,__buf_02,local_528.content.size_,(int)pcVar5);
  EzRpcServer::getWaitScope((EzRpcServer *)local_20);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_480,&local_4b8);
  uVar2 = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::getN
                    (&local_480.super_Reader);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            (&local_480);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &local_4b8);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_4f0);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_540);
  capnproto_test::capnp::test::TestCallOrder::Client::~Client(&local_508);
  Capability::Client::~Client(&local_518);
  if (uVar2 != 1) {
    local_541 = kj::_::Debug::shouldLog(ERROR);
    while (iVar4 = (int)pcVar5, local_541 != false) {
      local_54c[1] = 1;
      kj::StringPtr::StringPtr(&local_638,"cap2");
      name_03.content.size_ = (size_t)local_638.content.ptr;
      name_03.content.ptr = local_d0;
      sVar3 = local_638.content.size_;
      EzRpcClient::importCap((EzRpcClient *)&local_628,name_03);
      Capability::Client::castAs<capnproto_test::capnp::test::TestCallOrder>(&local_618,&local_628);
      kj::Maybe<capnp::MessageSize>::Maybe(&local_650,(void *)0x0);
      capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
                (&local_600,&local_618,&local_650);
      Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
      ::send(&local_5c8,(int)&local_600,__buf_03,sVar3,iVar4);
      EzRpcServer::getWaitScope((EzRpcServer *)local_20);
      kj::
      Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              *)&local_590,&local_5c8);
      local_54c[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::
                     getN(&local_590.super_Reader);
      pcVar5 = 
      "failed: expected (1) == (client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())"
      ;
      kj::_::Debug::log<char_const(&)[149],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
                 ,0x46,ERROR,
                 "\"failed: expected \" \"(1) == (client.importCap(\\\"cap2\\\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())\", 1, client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN()"
                 ,(char (*) [149])
                  "failed: expected (1) == (client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())"
                 ,(int *)(local_54c + 1),local_54c);
      Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
                (&local_590);
      RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::
      ~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                      *)&local_5c8);
      Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
      ::~Request(&local_600);
      kj::Maybe<capnp::MessageSize>::~Maybe(&local_650);
      capnproto_test::capnp::test::TestCallOrder::Client::~Client(&local_618);
      Capability::Client::~Client(&local_628);
      local_541 = false;
    }
  }
  Response<capnproto_test::capnp::test::TestInterface::FooResults>::~Response
            ((Response<capnproto_test::capnp::test::TestInterface::FooResults> *)local_1c8);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_168);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_120);
  EzRpcClient::~EzRpcClient((EzRpcClient *)local_d0);
  EzRpcServer::~EzRpcServer((EzRpcServer *)local_20);
  return;
}

Assistant:

TEST(EzRpc, DeprecatedNames) {
  EzRpcServer server("localhost");
  int callCount = 0;
  server.exportCap("cap1", kj::heap<TestInterfaceImpl>(callCount));
  server.exportCap("cap2", kj::heap<TestCallOrderImpl>());

  EzRpcClient client("localhost", server.getPort().wait(server.getWaitScope()));

  auto cap = client.importCap<test::TestInterface>("cap1");
  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);

  EXPECT_EQ(0, callCount);
  auto response = request.send().wait(server.getWaitScope());
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(1, callCount);

  EXPECT_EQ(0, client.importCap("cap2").castAs<test::TestCallOrder>()
      .getCallSequenceRequest().send().wait(server.getWaitScope()).getN());
  EXPECT_EQ(1, client.importCap("cap2").castAs<test::TestCallOrder>()
      .getCallSequenceRequest().send().wait(server.getWaitScope()).getN());
}